

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O0

int streamDispatch(mpt_input *in,mpt_event_handler_t cmd,void *arg)

{
  _mpt_vptr_input *p_Var1;
  int iVar2;
  mpt_input *local_58;
  streamWrap sw;
  int ret;
  ssize_t len;
  mpt_streamInput *srm;
  void *arg_local;
  mpt_event_handler_t cmd_local;
  mpt_input *in_local;
  
  p_Var1 = in[0xb]._vptr;
  if ((long)p_Var1 < 0) {
    sw.arg._4_4_ = mpt_queue_recv(in + 3);
    if (sw.arg._4_4_ < 0) {
      return sw.arg._4_4_;
    }
    if (sw.arg._4_4_ == 0) {
      iVar2 = _mpt_stream_fread((mpt_streaminfo *)(in + 2));
      if (iVar2 < 0) {
        return 0;
      }
      return 0;
    }
  }
  if (cmd == (mpt_event_handler_t)0x0) {
    in[9]._vptr = (_mpt_vptr_input *)
                  ((long)&((in[9]._vptr)->meta).convertable.convert +
                  (long)&(p_Var1->meta).convertable.convert);
    in[10]._vptr = (_mpt_vptr_input *)((long)in[10]._vptr - (long)p_Var1);
    in[0xb]._vptr = (_mpt_vptr_input *)0xffffffffffffffff;
    mpt_queue_shift(in + 3);
    iVar2 = mpt_queue_recv(in + 3);
    in_local._4_4_ = 0;
    if (0 < iVar2) {
      in_local._4_4_ = 0x10000;
    }
  }
  else {
    local_58 = in;
    sw.in = (mpt_streamInput *)cmd;
    sw.cmd = (mpt_event_handler_t)arg;
    in_local._4_4_ = mpt_stream_dispatch((mpt_stream *)(in + 2),streamMessage,&local_58);
  }
  return in_local._4_4_;
}

Assistant:

static int streamDispatch(MPT_INTERFACE(input) *in, MPT_TYPE(event_handler) cmd, void *arg)
{
	MPT_STRUCT(streamInput) *srm = (void *) in;
	ssize_t len;
	int ret;
	
	if ((len = srm->data._rd._state.data.msg) < 0) {
		if ((ret = mpt_queue_recv(&srm->data._rd)) < 0) {
			return ret;
		}
		if (!ret) {
			if ((ret = _mpt_stream_fread(&srm->data._info)) < 0) {
				return 0;
			} else {
				return MPT_EVENTFLAG(None);
			}
		}
	}
	if (cmd) {
		struct streamWrap sw;
		sw.in = srm;
		sw.cmd = cmd;
		sw.arg = arg;
		return mpt_stream_dispatch(&srm->data, streamMessage, &sw);
	}
	srm->data._rd._state.data.pos += len;
	srm->data._rd._state.data.len -= len;
	srm->data._rd._state.data.msg = -1;
	mpt_queue_shift(&srm->data._rd);
	
	ret = mpt_queue_recv(&srm->data._rd);
	
	return (ret > 0) ? MPT_EVENTFLAG(Retry) : MPT_EVENTFLAG(None);
}